

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O0

bool __thiscall
JITTimeWorkItem::TryGetValueType(JITTimeWorkItem *this,uint symId,ValueType *valueType)

{
  code *pcVar1;
  bool bVar2;
  TSize TVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2e;
  uint local_2c;
  ValueType type;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paStack_28;
  uint index;
  ValueType *valueType_local;
  uint symId_local;
  JITTimeWorkItem *this_local;
  
  paStack_28 = &valueType->field_0;
  bVar2 = IsLoopBody(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                       ,0xb3,"(IsLoopBody())","IsLoopBody()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  RVar4 = JITTimeFunctionBody::GetConstCount(&this->m_jitBody);
  local_2c = symId - RVar4;
  RVar4 = JITTimeFunctionBody::GetConstCount(&this->m_jitBody);
  if ((RVar4 <= symId) && (local_2c < this->m_workItemData->symIdToValueTypeMapCount)) {
    local_2e = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                (this->m_workItemData->symIdToValueTypeMap + local_2c);
    TVar3 = ValueType::GetRawData((ValueType *)&local_2e.field_0);
    if (TVar3 != 0) {
      *paStack_28 = local_2e;
      return true;
    }
  }
  return false;
}

Assistant:

bool
JITTimeWorkItem::TryGetValueType(uint symId, ValueType * valueType) const
{
    Assert(IsLoopBody());
    uint index = symId - m_jitBody.GetConstCount();
    if (symId >= m_jitBody.GetConstCount() && index < m_workItemData->symIdToValueTypeMapCount)
    {
        ValueType type = ((ValueType*)m_workItemData->symIdToValueTypeMap)[index];
        if (type.GetRawData() != 0)
        {
            *valueType = type;
            return true;
        }
    }
    return false;
}